

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pod_vector.h
# Opt level: O3

void bk_lib::detail::fill<Clasp::ConstString>(ConstString *first,ConstString *last,ConstString *x)

{
  int *piVar1;
  RefCount *p_2;
  RefCount *p;
  ConstString *pCVar2;
  ConstString *pCVar3;
  
  pCVar2 = first;
  pCVar3 = first;
  switch((uint)((int)last - (int)first) >> 3 & 7) {
  case 0:
    while (pCVar2 != last) {
      first = pCVar2 + 1;
      piVar1 = (int *)x->ref_;
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      pCVar2->ref_ = (RefType)piVar1;
switchD_001634b2_caseD_7:
      pCVar3 = first + 1;
      piVar1 = (int *)x->ref_;
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      first->ref_ = (RefType)piVar1;
switchD_001634b2_caseD_6:
      first = pCVar3 + 1;
      piVar1 = (int *)x->ref_;
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      pCVar3->ref_ = (RefType)piVar1;
switchD_001634b2_caseD_5:
      pCVar3 = first + 1;
      piVar1 = (int *)x->ref_;
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      first->ref_ = (RefType)piVar1;
switchD_001634b2_caseD_4:
      pCVar2 = pCVar3 + 1;
      piVar1 = (int *)x->ref_;
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      pCVar3->ref_ = (RefType)piVar1;
switchD_001634b2_caseD_3:
      first = pCVar2 + 1;
      piVar1 = (int *)x->ref_;
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      pCVar2->ref_ = (RefType)piVar1;
switchD_001634b2_caseD_2:
      pCVar3 = first + 1;
      piVar1 = (int *)x->ref_;
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      first->ref_ = (RefType)piVar1;
switchD_001634b2_caseD_1:
      pCVar2 = pCVar3 + 1;
      piVar1 = (int *)x->ref_;
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      pCVar3->ref_ = (RefType)piVar1;
    }
    break;
  case 1:
    goto switchD_001634b2_caseD_1;
  case 2:
    goto switchD_001634b2_caseD_2;
  case 3:
    goto switchD_001634b2_caseD_3;
  case 4:
    goto switchD_001634b2_caseD_4;
  case 5:
    goto switchD_001634b2_caseD_5;
  case 6:
    goto switchD_001634b2_caseD_6;
  case 7:
    goto switchD_001634b2_caseD_7;
  }
  return;
}

Assistant:

void fill(T* first, T* last, const T& x) {
		assert(first <= last);
		switch ((last - first) & 7u)
		{
		case 0:
				while (first != last)
				{
				new(first++) T(x);
		case 7: new(first++) T(x);
		case 6: new(first++) T(x);
		case 5: new(first++) T(x);
		case 4: new(first++) T(x);
		case 3: new(first++) T(x);
		case 2: new(first++) T(x);
		case 1: new(first++) T(x);
				assert(first <= last);
				}
		}
	}